

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>::Block
          (Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *this,
          Matrix<double,_4,_1,_0,_4,_1> *xpr,Index a_startRow,Index a_startCol,Index blockRows,
          Index blockCols)

{
  bool bVar1;
  Index IVar2;
  BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_Eigen::Dense> *in_RCX;
  long in_RDX;
  Matrix<double,_4,_1,_0,_4,_1> *in_R8;
  Index in_R9;
  Index in_stack_ffffffffffffffb8;
  Index in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  BlockImpl<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false,_Eigen::Dense>::BlockImpl
            (in_RCX,in_R8,in_R9,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_R9 != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8b,
                  "Eigen::Block<Eigen::Matrix<double, 4, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 4, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  bVar1 = false;
  if ((-1 < in_RDX) && (bVar1 = false, -1 < (long)in_R8)) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x2b0852);
    bVar1 = false;
    if ((in_RDX <= IVar2 - (long)in_R8) &&
       ((bVar1 = false, -1 < (long)in_RCX && (bVar1 = false, -1 < in_R9)))) {
      IVar2 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x2b0899);
      bVar1 = (long)in_RCX <= IVar2 - in_R9;
    }
  }
  if (!bVar1) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Matrix<double, 4, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 4, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  return;
}

Assistant:

inline Block(XprType& xpr,
          Index a_startRow, Index a_startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, a_startRow, a_startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(a_startRow >= 0 && blockRows >= 0 && a_startRow  <= xpr.rows() - blockRows
          && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols);
    }